

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

TestRole __thiscall testing::internal::ExecDeathTest::AssumeRole(ExecDeathTest *this)

{
  bool bVar1;
  int iVar2;
  TestResult *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  int *piVar3;
  DeathTestImpl *in_RDI;
  int in_stack_0000013c;
  char **in_stack_00000140;
  int gtest_retval;
  pid_t child_pid;
  Arguments args;
  string internal_flag;
  string filter_flag;
  int pipe_fd [2];
  int death_test_index;
  TestInfo *info;
  InternalRunDeathTestFlag *flag;
  UnitTestImpl *impl;
  undefined7 in_stack_fffffffffffff990;
  undefined1 in_stack_fffffffffffff997;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff998;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs_00;
  undefined7 in_stack_fffffffffffff9a0;
  undefined1 in_stack_fffffffffffff9a7;
  undefined1 uVar4;
  int *in_stack_fffffffffffff9b8;
  allocator<char> *streamable;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9d0;
  string local_600 [39];
  undefined1 local_5d9 [33];
  string local_5b8 [32];
  string local_598 [32];
  string local_578 [32];
  string local_558 [32];
  string local_538 [32];
  string local_518 [36];
  int local_4f4;
  pid_t local_4f0;
  allocator<char> local_4e9;
  string local_4e8 [80];
  string local_498 [32];
  string local_478 [32];
  string local_458 [39];
  undefined1 local_431 [33];
  string local_410 [32];
  string local_3f0 [32];
  string local_3d0 [32];
  string local_3b0 [32];
  string local_390 [32];
  string local_370 [32];
  string local_350 [32];
  string local_330 [32];
  string local_310 [39];
  allocator<char> local_2e9;
  string local_2e8 [32];
  string local_2c8 [32];
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  string local_248 [36];
  undefined4 local_224;
  string local_220 [39];
  allocator<char> local_1f9;
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [36];
  undefined4 local_134;
  string local_130 [55];
  allocator<char> local_f9;
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [36];
  int local_34;
  int local_30;
  int local_2c;
  TestInfo *local_28;
  InternalRunDeathTestFlag *local_20;
  UnitTestImpl *local_18;
  TestRole local_4;
  
  local_18 = GetUnitTestImpl();
  local_20 = UnitTestImpl::internal_run_death_test_flag((UnitTestImpl *)0x597986);
  local_28 = UnitTestImpl::current_test_info(local_18);
  this_00 = TestInfo::result(local_28);
  local_2c = TestResult::death_test_count(this_00);
  if (local_20 == (InternalRunDeathTestFlag *)0x0) {
    do {
      iVar2 = pipe(&local_34);
      bVar1 = IsTrue(iVar2 != -1);
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff9d0,(char *)in_stack_fffffffffffff9c8,
                   (allocator<char> *)in_stack_fffffffffffff9c0);
        std::operator+(in_stack_fffffffffffff998,
                       (char *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
        std::operator+(in_stack_fffffffffffff998,
                       (char *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
        local_134 = 0x58c;
        StreamableToString<int>(in_stack_fffffffffffff9b8);
        std::operator+(in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
        std::operator+(in_stack_fffffffffffff998,
                       (char *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
        std::operator+(in_stack_fffffffffffff998,
                       (char *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
        DeathTestAbort((string *)CONCAT17(in_stack_fffffffffffff9a7,in_stack_fffffffffffff9a0));
        std::__cxx11::string::~string(local_58);
        std::__cxx11::string::~string(local_78);
        std::__cxx11::string::~string(local_98);
        std::__cxx11::string::~string(local_130);
        std::__cxx11::string::~string(local_b8);
        std::__cxx11::string::~string(local_d8);
        std::__cxx11::string::~string(local_f8);
        std::allocator<char>::~allocator(&local_f9);
      }
      bVar1 = AlwaysFalse();
    } while (bVar1);
    do {
      iVar2 = fcntl(local_30,2,0);
      bVar1 = IsTrue(iVar2 != -1);
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff9d0,(char *)in_stack_fffffffffffff9c8,
                   (allocator<char> *)in_stack_fffffffffffff9c0);
        std::operator+(in_stack_fffffffffffff998,
                       (char *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
        std::operator+(in_stack_fffffffffffff998,
                       (char *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
        local_224 = 0x58f;
        StreamableToString<int>(in_stack_fffffffffffff9b8);
        std::operator+(in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
        std::operator+(in_stack_fffffffffffff998,
                       (char *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
        std::operator+(in_stack_fffffffffffff998,
                       (char *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
        DeathTestAbort((string *)CONCAT17(in_stack_fffffffffffff9a7,in_stack_fffffffffffff9a0));
        std::__cxx11::string::~string(local_158);
        std::__cxx11::string::~string(local_178);
        std::__cxx11::string::~string(local_198);
        std::__cxx11::string::~string(local_220);
        std::__cxx11::string::~string(local_1b8);
        std::__cxx11::string::~string(local_1d8);
        std::__cxx11::string::~string(local_1f8);
        std::allocator<char>::~allocator(&local_1f9);
      }
      bVar1 = AlwaysFalse();
    } while (bVar1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff9d0,(char *)in_stack_fffffffffffff9c8,
               (allocator<char> *)in_stack_fffffffffffff9c0);
    std::operator+(in_stack_fffffffffffff998,
                   (char *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
    std::operator+(in_stack_fffffffffffff998,
                   (char *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
    this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              TestInfo::test_suite_name((TestInfo *)0x597ff1);
    std::operator+(in_stack_fffffffffffff998,
                   (char *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
    std::operator+(in_stack_fffffffffffff998,
                   (char *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            TestInfo::name((TestInfo *)0x59803f);
    std::operator+(in_stack_fffffffffffff998,
                   (char *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
    std::__cxx11::string::~string(local_268);
    std::__cxx11::string::~string(local_288);
    std::__cxx11::string::~string(local_2a8);
    std::__cxx11::string::~string(local_2c8);
    std::__cxx11::string::~string(local_2e8);
    std::allocator<char>::~allocator(&local_2e9);
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_431;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_01,(char *)__lhs,(allocator<char> *)__rhs);
    std::operator+(in_stack_fffffffffffff998,
                   (char *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
    std::operator+(in_stack_fffffffffffff998,
                   (char *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
    std::operator+(in_stack_fffffffffffff998,
                   (char *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
    std::operator+(in_stack_fffffffffffff998,
                   (char *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
    StreamableToString<int>(in_stack_fffffffffffff9b8);
    std::operator+(__lhs,__rhs);
    std::operator+(in_stack_fffffffffffff998,
                   (char *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
    StreamableToString<int>(in_stack_fffffffffffff9b8);
    std::operator+(__lhs,__rhs);
    std::operator+(in_stack_fffffffffffff998,
                   (char *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
    StreamableToString<int>(in_stack_fffffffffffff9b8);
    std::operator+(__lhs,__rhs);
    std::__cxx11::string::~string(local_498);
    std::__cxx11::string::~string(local_330);
    std::__cxx11::string::~string(local_350);
    std::__cxx11::string::~string(local_478);
    std::__cxx11::string::~string(local_370);
    std::__cxx11::string::~string(local_390);
    std::__cxx11::string::~string(local_458);
    std::__cxx11::string::~string(local_3b0);
    std::__cxx11::string::~string(local_3d0);
    std::__cxx11::string::~string(local_3f0);
    std::__cxx11::string::~string(local_410);
    std::__cxx11::string::~string((string *)(local_431 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_431);
    Arguments::Arguments((Arguments *)CONCAT17(in_stack_fffffffffffff9a7,in_stack_fffffffffffff9a0))
    ;
    GetArgvsForDeathTestChildProcess_abi_cxx11_();
    Arguments::AddArguments<std::__cxx11::string>
              ((Arguments *)this_01,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)__lhs);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT17(in_stack_fffffffffffff9a7,in_stack_fffffffffffff9a0));
    std::__cxx11::string::c_str();
    Arguments::AddArgument((Arguments *)__rhs,(char *)in_stack_fffffffffffff9b8);
    std::__cxx11::string::c_str();
    Arguments::AddArgument((Arguments *)__rhs,(char *)in_stack_fffffffffffff9b8);
    streamable = &local_4e9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_01,(char *)__lhs,(allocator<char> *)__rhs);
    DeathTest::set_last_death_test_message((string *)0x598399);
    std::__cxx11::string::~string(local_4e8);
    std::allocator<char>::~allocator(&local_4e9);
    CaptureStderr();
    FlushInfoLog();
    Arguments::Argv((Arguments *)0x5983d0);
    local_4f0 = ExecDeathTestSpawnChild(in_stack_00000140,in_stack_0000013c);
    do {
      do {
        local_4f4 = close(local_30);
        uVar4 = false;
        if (local_4f4 == -1) {
          piVar3 = __errno_location();
          uVar4 = *piVar3 == 4;
        }
      } while ((bool)uVar4 != false);
      if (local_4f4 == -1) {
        __lhs_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5d9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this_01,(char *)__lhs,(allocator<char> *)__rhs);
        std::operator+(__lhs_00,(char *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990
                                                ));
        std::operator+(__lhs_00,(char *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990
                                                ));
        StreamableToString<int>((int *)streamable);
        std::operator+(__lhs,__rhs);
        std::operator+(__lhs_00,(char *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990
                                                ));
        std::operator+(__lhs_00,(char *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990
                                                ));
        std::operator+(__lhs_00,(char *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990
                                                ));
        DeathTestAbort((string *)CONCAT17(uVar4,in_stack_fffffffffffff9a0));
        std::__cxx11::string::~string(local_518);
        std::__cxx11::string::~string(local_538);
        std::__cxx11::string::~string(local_558);
        std::__cxx11::string::~string(local_578);
        std::__cxx11::string::~string(local_600);
        std::__cxx11::string::~string(local_598);
        std::__cxx11::string::~string(local_5b8);
        std::__cxx11::string::~string((string *)(local_5d9 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_5d9);
      }
      in_stack_fffffffffffff997 = AlwaysFalse();
    } while ((bool)in_stack_fffffffffffff997);
    ForkingDeathTest::set_child_pid((ForkingDeathTest *)in_RDI,local_4f0);
    DeathTestImpl::set_read_fd(in_RDI,local_34);
    DeathTestImpl::set_spawned(in_RDI,true);
    local_4 = OVERSEE_TEST;
    Arguments::~Arguments((Arguments *)CONCAT17(uVar4,in_stack_fffffffffffff9a0));
    std::__cxx11::string::~string(local_310);
    std::__cxx11::string::~string(local_248);
  }
  else {
    iVar2 = InternalRunDeathTestFlag::write_fd(local_20);
    DeathTestImpl::set_write_fd(in_RDI,iVar2);
    local_4 = EXECUTE_TEST;
  }
  return local_4;
}

Assistant:

DeathTest::TestRole ExecDeathTest::AssumeRole() {
  const UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const TestInfo* const info = impl->current_test_info();
  const int death_test_index = info->result()->death_test_count();

  if (flag != nullptr) {
    set_write_fd(flag->write_fd());
    return EXECUTE_TEST;
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);
  // Clear the close-on-exec flag on the write end of the pipe, lest
  // it be closed when the child process does an exec:
  GTEST_DEATH_TEST_CHECK_(fcntl(pipe_fd[1], F_SETFD, 0) != -1);

  const std::string filter_flag = std::string("--") + GTEST_FLAG_PREFIX_ +
                                  "filter=" + info->test_suite_name() + "." +
                                  info->name();
  const std::string internal_flag = std::string("--") + GTEST_FLAG_PREFIX_ +
                                    "internal_run_death_test=" + file_ + "|" +
                                    StreamableToString(line_) + "|" +
                                    StreamableToString(death_test_index) + "|" +
                                    StreamableToString(pipe_fd[1]);
  Arguments args;
  args.AddArguments(GetArgvsForDeathTestChildProcess());
  args.AddArgument(filter_flag.c_str());
  args.AddArgument(internal_flag.c_str());

  DeathTest::set_last_death_test_message("");

  CaptureStderr();
  // See the comment in NoExecDeathTest::AssumeRole for why the next line
  // is necessary.
  FlushInfoLog();

  const pid_t child_pid = ExecDeathTestSpawnChild(args.Argv(), pipe_fd[0]);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
  set_child_pid(child_pid);
  set_read_fd(pipe_fd[0]);
  set_spawned(true);
  return OVERSEE_TEST;
}